

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtw_merge.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *__s_00;
  long lVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  size_t sVar7;
  long lVar8;
  string *input_stream;
  int iVar9;
  int read_size;
  char *__s_01;
  size_type __n;
  int iVar10;
  int num_order;
  int curr_reference_vector_index;
  int curr_query_vector_index;
  vector<double,_std::allocator<double>_> reference_vector;
  vector<double,_std::allocator<double>_> query_vector;
  ifstream ifs1;
  ostringstream error_message_6;
  ifstream ifs2;
  ifstream ifs3;
  int local_820;
  int local_81c;
  int local_818;
  int local_814;
  string local_810;
  vector<double,_std::allocator<double>_> local_7f0;
  vector<double,_std::allocator<double>_> local_7d8;
  string local_7c0;
  byte abStack_7a0 [80];
  ios_base local_750 [408];
  string local_5b8 [3];
  ios_base local_548 [264];
  string local_440;
  byte abStack_420 [80];
  ios_base local_3d0 [408];
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_81c = 0x19;
  do {
    while( true ) {
      iVar6 = ya_getopt_long(argc,argv,"l:m:h",(option *)0x0,(int *)0x0);
      if (iVar6 < 0x6d) break;
      if (iVar6 != 0x6d) goto LAB_0010284a;
      std::__cxx11::string::string((string *)&local_7c0,ya_optarg,(allocator *)&local_440);
      bVar4 = sptk::ConvertStringToInteger(&local_7c0,&local_81c);
      bVar3 = local_81c < 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
        operator_delete(local_7c0._M_dataplus._M_p);
      }
      if (!bVar4 || bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_7c0,"The argument for the -m option must be a ",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_7c0,"non-negative integer",0x14);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"dtw_merge","");
        sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_7c0);
LAB_00102a1c:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_440._M_dataplus._M_p != &local_440.field_2) {
          operator_delete(local_440._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_7c0);
        std::ios_base::~ios_base(local_750);
        return 1;
      }
    }
    if (iVar6 != 0x6c) {
      if (iVar6 != -1) {
        if (iVar6 == 0x68) {
          anon_unknown.dwarf_2bfc::PrintUsage((ostream *)&std::cout);
          return 0;
        }
LAB_0010284a:
        anon_unknown.dwarf_2bfc::PrintUsage((ostream *)&std::cerr);
        return 1;
      }
      if (argc - ya_optind == 2) {
        lVar1 = (long)argc + -2;
        lVar2 = (long)argc + -1;
        __s_01 = (char *)0x0;
      }
      else {
        if (argc - ya_optind != 3) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7c0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_7c0,"Three input files are required",0x1e);
          local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"dtw_merge","");
          sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_7c0);
          goto LAB_00102a1c;
        }
        lVar8 = (long)argc;
        lVar1 = lVar8 + -3;
        lVar2 = lVar8 + -2;
        __s_01 = argv[lVar8 + -1];
      }
      __s = argv[lVar1];
      __s_00 = argv[lVar2];
      bVar4 = sptk::SetBinaryMode();
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_7c0,"Cannot set translation mode",0x1b);
        local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"dtw_merge","");
        sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_7c0);
        goto LAB_00102a1c;
      }
      std::ifstream::ifstream(&local_7c0);
      std::ifstream::open((char *)&local_7c0,(_Ios_Openmode)__s);
      if ((abStack_7a0[*(long *)(local_7c0._M_dataplus._M_p + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_440);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_440,"Cannot open file ",0x11);
        if (__s == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffff7d8 +
                          (int)*(undefined8 *)(local_440._M_dataplus._M_p + -0x18) + 1000);
        }
        else {
          sVar7 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_440,__s,sVar7);
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"dtw_merge","");
        sptk::PrintErrorMessage(&local_238,(ostringstream *)&local_440);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_440);
        std::ios_base::~ios_base(local_3d0);
        iVar6 = 1;
        goto LAB_00103007;
      }
      std::ifstream::ifstream(&local_440);
      std::ifstream::open((char *)&local_440,(_Ios_Openmode)__s_00);
      if ((abStack_420[*(long *)(local_440._M_dataplus._M_p + -0x18)] & 5) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Cannot open file ",0x11);
        if (__s_00 == (char *)0x0) {
          std::ios::clear((int)&stack0xfffffffffffff7d8 +
                          (int)*(undefined8 *)(local_238._M_dataplus._M_p + -0x18) + 0x5f0);
        }
        else {
          sVar7 = strlen(__s_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_238,__s_00,sVar7);
        }
        local_5b8[0]._M_dataplus._M_p = (pointer)&local_5b8[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_5b8,"dtw_merge","");
        sptk::PrintErrorMessage(local_5b8,(ostringstream *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b8[0]._M_dataplus._M_p != &local_5b8[0].field_2) {
          operator_delete(local_5b8[0]._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
        std::ios_base::~ios_base(local_1c8);
        iVar6 = 1;
        goto LAB_00102ffa;
      }
      input_stream = &local_238;
      std::ifstream::ifstream(input_stream);
      if ((__s_01 != (char *)0x0) &&
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s_01),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_5b8,"Cannot open file ",0x11);
        sVar7 = strlen(__s_01);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b8,__s_01,sVar7);
        local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"dtw_merge","");
        sptk::PrintErrorMessage(&local_810,(ostringstream *)local_5b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_810._M_dataplus._M_p != &local_810.field_2) {
          operator_delete(local_810._M_dataplus._M_p);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
        std::ios_base::~ios_base(local_548);
        iVar6 = 1;
        goto LAB_00102fed;
      }
      cVar5 = std::__basic_file<char>::is_open();
      if (cVar5 == '\0') {
        input_stream = (string *)&std::cin;
      }
      __n = (long)local_81c + 1;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_7d8,__n,(allocator_type *)local_5b8);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_7f0,__n,(allocator_type *)local_5b8);
      read_size = (int)__n;
      bVar4 = sptk::ReadStream<double>
                        (false,0,0,read_size,&local_7d8,(istream *)input_stream,(int *)0x0);
      iVar6 = 0;
      if (!bVar4) goto LAB_00102fcf;
      bVar4 = sptk::ReadStream<double>
                        (false,0,0,read_size,&local_7f0,(istream *)&local_440,(int *)0x0);
      iVar6 = 0;
      if (!bVar4) goto LAB_00102fcf;
      iVar10 = 0;
      local_820 = 0;
      break;
    }
    std::__cxx11::string::string((string *)&local_7c0,ya_optarg,(allocator *)&local_440);
    bVar3 = sptk::ConvertStringToInteger(&local_7c0,&local_81c);
    bVar4 = local_81c < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7c0._M_dataplus._M_p != &local_7c0.field_2) {
      operator_delete(local_7c0._M_dataplus._M_p);
    }
    if (!bVar3 || bVar4) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_7c0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_7c0,"The argument for the -l option must be a positive integer",
                 0x39);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"dtw_merge","");
      sptk::PrintErrorMessage(&local_440,(ostringstream *)&local_7c0);
      goto LAB_00102a1c;
    }
    local_81c = local_81c + -1;
  } while( true );
LAB_00102dc8:
  bVar4 = sptk::ReadStream<int>(&local_814,(istream *)&local_7c0);
  iVar6 = 0;
  if ((!bVar4) || (bVar4 = sptk::ReadStream<int>(&local_818,(istream *)&local_7c0), !bVar4))
  goto LAB_00102fcf;
  if ((local_814 < 0) || (((local_818 < 0 || (local_814 < iVar10)) || (local_818 < local_820)))) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Invalid Viterbi path",0x14);
    local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"dtw_merge","");
    sptk::PrintErrorMessage(&local_810,(ostringstream *)local_5b8);
    goto LAB_00102f9a;
  }
  iVar9 = local_814 - iVar10;
  iVar6 = 0;
  if (iVar9 != 0 && iVar10 <= local_814) {
    do {
      bVar4 = sptk::ReadStream<double>
                        (false,0,0,read_size,&local_7d8,(istream *)input_stream,(int *)0x0);
      if (!bVar4) goto LAB_00102fcf;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  iVar10 = local_814;
  iVar9 = local_818 - local_820;
  if (iVar9 != 0 && local_820 <= local_818) {
    do {
      bVar4 = sptk::ReadStream<double>
                        (false,0,0,read_size,&local_7f0,(istream *)&local_440,(int *)0x0);
      if (!bVar4) goto LAB_00102fcf;
      iVar9 = iVar9 + -1;
    } while (iVar9 != 0);
  }
  local_820 = local_818;
  bVar4 = sptk::WriteStream<double>(0,read_size,&local_7d8,(ostream *)&std::cout,(int *)0x0);
  if ((!bVar4) ||
     (bVar4 = sptk::WriteStream<double>(0,read_size,&local_7f0,(ostream *)&std::cout,(int *)0x0),
     !bVar4)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_5b8,"Failed to write merged vector",0x1d);
    local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"dtw_merge","");
    sptk::PrintErrorMessage(&local_810,(ostringstream *)local_5b8);
LAB_00102f9a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_810._M_dataplus._M_p != &local_810.field_2) {
      operator_delete(local_810._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b8);
    std::ios_base::~ios_base(local_548);
    iVar6 = 1;
LAB_00102fcf:
    if (local_7f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
LAB_00102fed:
    std::ifstream::~ifstream(&local_238);
LAB_00102ffa:
    std::ifstream::~ifstream(&local_440);
LAB_00103007:
    std::ifstream::~ifstream(&local_7c0);
    return iVar6;
  }
  goto LAB_00102dc8;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("dtw_merge", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const char* viterbi_path_file;
  const char* reference_file;
  const char* query_file;
  const int num_input_files(argc - optind);
  if (3 == num_input_files) {
    viterbi_path_file = argv[argc - 3];
    reference_file = argv[argc - 2];
    query_file = argv[argc - 1];
  } else if (2 == num_input_files) {
    viterbi_path_file = argv[argc - 2];
    reference_file = argv[argc - 1];
    query_file = NULL;
  } else {
    std::ostringstream error_message;
    error_message << "Three input files are required";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }

  std::ifstream ifs1;
  ifs1.open(viterbi_path_file, std::ios::in | std::ios::binary);
  if (ifs1.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << viterbi_path_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_path(ifs1);

  std::ifstream ifs2;
  ifs2.open(reference_file, std::ios::in | std::ios::binary);
  if (ifs2.fail()) {
    std::ostringstream error_message;
    error_message << "Cannot open file " << reference_file;
    sptk::PrintErrorMessage("dtw_merge", error_message);
    return 1;
  }
  std::istream& input_stream_for_reference(ifs2);

  std::ifstream ifs3;
  if (NULL != query_file) {
    ifs3.open(query_file, std::ios::in | std::ios::binary);
    if (ifs3.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << query_file;
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }
  std::istream& input_stream_for_query(ifs3.is_open() ? ifs3 : std::cin);

  const int length(num_order + 1);
  std::vector<double> query_vector(length);
  std::vector<double> reference_vector(length);
  if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                        &input_stream_for_query, NULL) ||
      !sptk::ReadStream(false, 0, 0, length, &reference_vector,
                        &input_stream_for_reference, NULL)) {
    return 0;
  }

  int prev_query_vector_index(0), prev_reference_vector_index(0);
  int curr_query_vector_index, curr_reference_vector_index;
  while (
      sptk::ReadStream(&curr_query_vector_index, &input_stream_for_path) &&
      sptk::ReadStream(&curr_reference_vector_index, &input_stream_for_path)) {
    if (curr_query_vector_index < 0 || curr_reference_vector_index < 0 ||
        curr_query_vector_index < prev_query_vector_index ||
        curr_reference_vector_index < prev_reference_vector_index) {
      std::ostringstream error_message;
      error_message << "Invalid Viterbi path";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }

    {
      const int diff(curr_query_vector_index - prev_query_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &query_vector,
                              &input_stream_for_query, NULL)) {
          return 0;
        }
      }
      prev_query_vector_index = curr_query_vector_index;
    }

    {
      const int diff(curr_reference_vector_index - prev_reference_vector_index);
      for (int i(0); i < diff; ++i) {
        if (!sptk::ReadStream(false, 0, 0, length, &reference_vector,
                              &input_stream_for_reference, NULL)) {
          return 0;
        }
      }
      prev_reference_vector_index = curr_reference_vector_index;
    }

    if (!sptk::WriteStream(0, length, query_vector, &std::cout, NULL) ||
        !sptk::WriteStream(0, length, reference_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write merged vector";
      sptk::PrintErrorMessage("dtw_merge", error_message);
      return 1;
    }
  }

  return 0;
}